

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_gui.cpp
# Opt level: O0

bool I_SetCursor(FTexture *cursorpic)

{
  int *buffer_00;
  void *__dest;
  int iVar1;
  BYTE *__src;
  undefined1 local_1048 [8];
  FBitmap bmp;
  BYTE buffer [4096];
  FTexture *cursorpic_local;
  
  SDL_ShowCursor(0);
  if ((cursorpic == (FTexture *)0x0) || (cursorpic->UseType == '\r')) {
    if (I_SetCursor::cursor != (SDL_Cursor *)0x0) {
      SDL_SetCursor(0);
      SDL_FreeCursor(I_SetCursor::cursor);
      I_SetCursor::cursor = (SDL_Cursor *)0x0;
    }
    if (I_SetCursor::cursorSurface != (SDL_Surface *)0x0) {
      SDL_FreeSurface(I_SetCursor::cursorSurface);
      I_SetCursor::cursorSurface = (SDL_Surface *)0x0;
    }
  }
  else {
    iVar1 = FTexture::GetWidth(cursorpic);
    if ((0x20 < iVar1) || (iVar1 = FTexture::GetHeight(cursorpic), 0x20 < iVar1)) {
      return false;
    }
    if (I_SetCursor::cursorSurface == (SDL_Surface *)0x0) {
      SDL_LockSurface(0);
    }
    buffer_00 = &bmp.ClipRect.width;
    memset(buffer_00,0,0x1000);
    FBitmap::FBitmap((FBitmap *)local_1048,(BYTE *)buffer_00,0x80,0x20,0x20);
    (*cursorpic->_vptr_FTexture[4])(cursorpic,(FBitmap *)local_1048,0,0,0,0);
    __dest = I_SetCursor::cursorSurface->pixels;
    __src = FBitmap::GetPixels((FBitmap *)local_1048);
    memcpy(__dest,__src,0x1000);
    SDL_UnlockSurface(I_SetCursor::cursorSurface);
    FBitmap::~FBitmap((FBitmap *)local_1048);
  }
  return true;
}

Assistant:

bool I_SetCursor(FTexture *cursorpic)
{
	SDL_ShowCursor(SDL_DISABLE);
	static SDL_Cursor *cursor;
	static SDL_Surface *cursorSurface;

	if (cursorpic != NULL && cursorpic->UseType != FTexture::TEX_Null)
	{
		// Must be no larger than 32x32.
		if (cursorpic->GetWidth() > 32 || cursorpic->GetHeight() > 32)
		{
			return false;
		}

		if (cursorSurface == NULL)
//			cursorSurface = SDL_CreateRGBSurface (0, 32, 32, 32, MAKEARGB(0,255,0,0), MAKEARGB(0,0,255,0), MAKEARGB(0,0,0,255), MAKEARGB(255,0,0,0));

		SDL_LockSurface(cursorSurface);
		BYTE buffer[32*32*4];
		memset(buffer, 0, 32*32*4);
		FBitmap bmp(buffer, 32*4, 32, 32);
		cursorpic->CopyTrueColorPixels(&bmp, 0, 0);
		memcpy(cursorSurface->pixels, bmp.GetPixels(), 32*32*4);
		SDL_UnlockSurface(cursorSurface);

//		if (cursor)
//			SDL_FreeCursor (cursor);
//		cursor = SDL_CreateColorCursor (cursorSurface, 0, 0);
//		SDL_SetCursor (cursor);
//		SDL_ShowCursor(SDL_ENABLE);
	}
	else
	{
		if (cursor)
		{
			SDL_SetCursor (NULL);
			SDL_FreeCursor (cursor);
			cursor = NULL;
		}
		if (cursorSurface != NULL)
		{
			SDL_FreeSurface(cursorSurface);
			cursorSurface = NULL;
		}
	}
	return true;
}